

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildStatementFence(void)

{
  NscSymbolFence *pNVar1;
  CNscPStackEntry *this;
  
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript != true)) {
    this = (CNscPStackEntry *)0x0;
  }
  else {
    this = CNscContext::GetPStackEntryInt(g_pCtx);
    CNscPStackEntry::SetType(this,NscType_Unknown);
    pNVar1 = g_pCtx->m_pCurrentFence;
    if ((pNVar1 == (NscSymbolFence *)0x0) || (pNVar1->fEatScope != true)) {
      NscPushFence(this,(NscSymbol *)0x0,NscFenceType_Scope,false);
    }
    else {
      pNVar1->fEatScope = false;
    }
  }
  return this;
}

Assistant:

YYSTYPE NscBuildStatementFence ()
{
	CNscPStackEntry *pOut;

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		pOut = NULL;
	}

	//
	// Otherwise, create a new fence
	//

	else
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);

		//
		// A new fence isn't really created unless we are inside a function
		// and if the previous fence isn't marked to eat the next fence.
		// The eat fence is used for constructs such as IF that create their
		// own fence and need the '{}' to not create their's.
		//

		NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
		if (pFence == NULL)
            NscPushFence (pOut, NULL, NscFenceType_Scope, false);
		else
		{
			if (pFence ->fEatScope)
				pFence ->fEatScope = false;
			else
	            NscPushFence (pOut, NULL, NscFenceType_Scope, false);
		}
	}
	return pOut;
}